

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hist.c
# Opt level: O2

size_t HIST_count_parallel_wksp
                 (uint *count,uint *maxSymbolValuePtr,void *source,size_t sourceSize,
                 HIST_checkInput_e check,U32 *workSpace)

{
  U32 *pUVar1;
  int *piVar2;
  U32 s;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  byte *pbVar7;
  size_t sVar8;
  
  uVar3 = *maxSymbolValuePtr;
  memset(workSpace,0,0x1000);
  if (sourceSize == 0) {
    sVar8 = 0;
    memset(count,0,(ulong)(uVar3 + 1));
    *maxSymbolValuePtr = 0;
  }
  else {
    pbVar7 = (byte *)(sourceSize + (long)source);
    uVar4 = *source;
    for (; (byte *)((long)source + 4) < pbVar7 + -0xf; source = (void *)((long)source + 0x10)) {
      uVar6 = *(uint *)((long)source + 4);
      workSpace[uVar4 & 0xff] = workSpace[uVar4 & 0xff] + 1;
      workSpace[(ulong)(uVar4 >> 8 & 0xff) + 0x100] =
           workSpace[(ulong)(uVar4 >> 8 & 0xff) + 0x100] + 1;
      piVar2 = (int *)((long)workSpace + (ulong)(uVar4 >> 0xe & 0x3fc) + 0x800);
      *piVar2 = *piVar2 + 1;
      workSpace[(ulong)(uVar4 >> 0x18) + 0x300] = workSpace[(ulong)(uVar4 >> 0x18) + 0x300] + 1;
      uVar4 = *(uint *)((long)source + 8);
      workSpace[uVar6 & 0xff] = workSpace[uVar6 & 0xff] + 1;
      workSpace[(ulong)(uVar6 >> 8 & 0xff) + 0x100] =
           workSpace[(ulong)(uVar6 >> 8 & 0xff) + 0x100] + 1;
      piVar2 = (int *)((long)workSpace + (ulong)(uVar6 >> 0xe & 0x3fc) + 0x800);
      *piVar2 = *piVar2 + 1;
      workSpace[(ulong)(uVar6 >> 0x18) + 0x300] = workSpace[(ulong)(uVar6 >> 0x18) + 0x300] + 1;
      uVar6 = *(uint *)((long)source + 0xc);
      workSpace[uVar4 & 0xff] = workSpace[uVar4 & 0xff] + 1;
      workSpace[(ulong)(uVar4 >> 8 & 0xff) + 0x100] =
           workSpace[(ulong)(uVar4 >> 8 & 0xff) + 0x100] + 1;
      piVar2 = (int *)((long)workSpace + (ulong)(uVar4 >> 0xe & 0x3fc) + 0x800);
      *piVar2 = *piVar2 + 1;
      workSpace[(ulong)(uVar4 >> 0x18) + 0x300] = workSpace[(ulong)(uVar4 >> 0x18) + 0x300] + 1;
      uVar4 = *(uint *)((long)source + 0x10);
      workSpace[uVar6 & 0xff] = workSpace[uVar6 & 0xff] + 1;
      workSpace[(ulong)(uVar6 >> 8 & 0xff) + 0x100] =
           workSpace[(ulong)(uVar6 >> 8 & 0xff) + 0x100] + 1;
      piVar2 = (int *)((long)workSpace + (ulong)(uVar6 >> 0xe & 0x3fc) + 0x800);
      *piVar2 = *piVar2 + 1;
      workSpace[(ulong)(uVar6 >> 0x18) + 0x300] = workSpace[(ulong)(uVar6 >> 0x18) + 0x300] + 1;
    }
    for (; source < pbVar7; source = (void *)((long)source + 1)) {
      workSpace[*source] = workSpace[*source] + 1;
    }
    if (uVar3 == 0) {
      uVar3 = 0xff;
    }
    if (check == trustInput) {
LAB_00423782:
      uVar4 = 0xff;
      if (uVar3 < 0xff) {
        uVar4 = uVar3;
      }
      uVar3 = 0;
      for (uVar5 = 0; uVar4 + 1 != uVar5; uVar5 = uVar5 + 1) {
        uVar6 = workSpace[uVar5 + 0x100] + workSpace[uVar5] + workSpace[uVar5 + 0x200] +
                workSpace[uVar5 + 0x300];
        count[uVar5] = uVar6;
        if (uVar3 < uVar6) {
          uVar3 = uVar6;
        }
      }
      do {
        uVar6 = uVar4;
        uVar4 = uVar6 - 1;
      } while (count[uVar6] == 0);
      *maxSymbolValuePtr = uVar6;
      sVar8 = (size_t)uVar3;
    }
    else {
      sVar8 = 0xffffffffffffffd0;
      uVar4 = 0xff;
      do {
        if (uVar4 <= uVar3) goto LAB_00423782;
        pUVar1 = workSpace + uVar4;
        *pUVar1 = *pUVar1 + workSpace[(ulong)uVar4 + 0x200] + workSpace[(ulong)uVar4 + 0x100] +
                            workSpace[(ulong)uVar4 + 0x300];
        uVar4 = uVar4 - 1;
      } while (*pUVar1 == 0);
    }
  }
  return sVar8;
}

Assistant:

static size_t HIST_count_parallel_wksp(
                                unsigned* count, unsigned* maxSymbolValuePtr,
                                const void* source, size_t sourceSize,
                                HIST_checkInput_e check,
                                U32* const workSpace)
{
    const BYTE* ip = (const BYTE*)source;
    const BYTE* const iend = ip+sourceSize;
    unsigned maxSymbolValue = *maxSymbolValuePtr;
    unsigned max=0;
    U32* const Counting1 = workSpace;
    U32* const Counting2 = Counting1 + 256;
    U32* const Counting3 = Counting2 + 256;
    U32* const Counting4 = Counting3 + 256;

    memset(workSpace, 0, 4*256*sizeof(unsigned));

    /* safety checks */
    if (!sourceSize) {
        memset(count, 0, maxSymbolValue + 1);
        *maxSymbolValuePtr = 0;
        return 0;
    }
    if (!maxSymbolValue) maxSymbolValue = 255;            /* 0 == default */

    /* by stripes of 16 bytes */
    {   U32 cached = MEM_read32(ip); ip += 4;
        while (ip < iend-15) {
            U32 c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
            c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
            c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
            c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
        }
        ip-=4;
    }

    /* finish last symbols */
    while (ip<iend) Counting1[*ip++]++;

    if (check) {   /* verify stats will fit into destination table */
        U32 s; for (s=255; s>maxSymbolValue; s--) {
            Counting1[s] += Counting2[s] + Counting3[s] + Counting4[s];
            if (Counting1[s]) return ERROR(maxSymbolValue_tooSmall);
    }   }

    {   U32 s;
        if (maxSymbolValue > 255) maxSymbolValue = 255;
        for (s=0; s<=maxSymbolValue; s++) {
            count[s] = Counting1[s] + Counting2[s] + Counting3[s] + Counting4[s];
            if (count[s] > max) max = count[s];
    }   }

    while (!count[maxSymbolValue]) maxSymbolValue--;
    *maxSymbolValuePtr = maxSymbolValue;
    return (size_t)max;
}